

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O2

void Omega_h::print_goal_stats
               (Mesh *mesh,char *name,Int ent_dim,Reals *values,MinMax<double> desired,
               MinMax<double> actual)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  I32 IVar5;
  GO GVar6;
  GO GVar7;
  GO GVar8;
  ostream *poVar9;
  char *pcVar10;
  double b;
  double b_00;
  fmtflags __old;
  Comm *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  Write<signed_char> local_90;
  Write<signed_char> local_80;
  Write<double> local_70;
  Bytes high_marks;
  Bytes low_marks;
  Write<double> local_40;
  
  b_00 = desired.max;
  b = desired.min;
  Write<double>::Write(&local_40,&values->write_);
  each_lt<double>((Omega_h *)&low_marks,(Read<double> *)&local_40,b);
  Write<double>::~Write(&local_40);
  Write<double>::Write(&local_70,&values->write_);
  each_gt<double>((Omega_h *)&high_marks,(Read<double> *)&local_70,b_00);
  Write<double>::~Write(&local_70);
  Write<signed_char>::Write(&local_80,&low_marks.write_);
  GVar6 = count_owned_marks(mesh,ent_dim,(Read<signed_char> *)&local_80);
  Write<signed_char>::~Write(&local_80);
  Write<signed_char>::Write(&local_90,&high_marks.write_);
  GVar7 = count_owned_marks(mesh,ent_dim,(Read<signed_char> *)&local_90);
  Write<signed_char>::~Write(&local_90);
  GVar8 = Mesh::nglobal_ents(mesh,ent_dim);
  Mesh::comm((Mesh *)&local_a0);
  IVar5 = Comm::rank(local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  lVar4 = std::cout;
  if (IVar5 == 0) {
    lVar2 = *(long *)(std::cout + -0x18);
    uVar3 = *(undefined8 *)(operator_delete__ + lVar2);
    uVar1 = *(uint *)(std::__cxx11::string::string + lVar2);
    *(uint *)(std::__cxx11::string::string + lVar2) = uVar1 & 0xfffffefb | 4;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar4 + -0x18)) = 2;
    poVar9 = std::ostream::_M_insert<long>((long)&std::cout);
    poVar9 = std::operator<<(poVar9," ");
    pcVar10 = topological_plural_name(mesh->family_,ent_dim);
    std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<((ostream *)&std::cout,", ");
    poVar9 = std::operator<<(poVar9,name);
    std::operator<<(poVar9," [");
    poVar9 = std::ostream::_M_insert<double>(actual.min);
    std::operator<<(poVar9,",");
    poVar9 = std::ostream::_M_insert<double>(actual.max);
    std::operator<<(poVar9,"]");
    if (GVar6 != 0) {
      poVar9 = std::operator<<((ostream *)&std::cout,", ");
      poVar9 = std::ostream::_M_insert<long>((long)poVar9);
      std::operator<<(poVar9," <");
      std::ostream::_M_insert<double>(b);
    }
    if (GVar8 != GVar6 + GVar7) {
      poVar9 = std::operator<<((ostream *)&std::cout,", ");
      poVar9 = std::ostream::_M_insert<long>((long)poVar9);
      std::operator<<(poVar9," in [");
      poVar9 = std::ostream::_M_insert<double>(b);
      std::operator<<(poVar9,",");
      poVar9 = std::ostream::_M_insert<double>(b_00);
      std::operator<<(poVar9,"]");
    }
    if (GVar7 != 0) {
      poVar9 = std::operator<<((ostream *)&std::cout,", ");
      poVar9 = std::ostream::_M_insert<long>((long)poVar9);
      std::operator<<(poVar9," >");
      std::ostream::_M_insert<double>(b_00);
    }
    std::operator<<((ostream *)&std::cout,'\n');
    lVar4 = std::cout;
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = uVar1;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar4 + -0x18)) = uVar3;
  }
  Write<signed_char>::~Write(&high_marks.write_);
  Write<signed_char>::~Write(&low_marks.write_);
  return;
}

Assistant:

void print_goal_stats(Mesh* mesh, char const* name, Int ent_dim, Reals values,
    MinMax<Real> desired, MinMax<Real> actual) {
  auto low_marks = each_lt(values, desired.min);
  auto high_marks = each_gt(values, desired.max);
  auto nlow = count_owned_marks(mesh, ent_dim, low_marks);
  auto nhigh = count_owned_marks(mesh, ent_dim, high_marks);
  auto ntotal = mesh->nglobal_ents(ent_dim);
  auto nmid = ntotal - nlow - nhigh;
  if (mesh->comm()->rank() == 0) {
    auto precision_before = std::cout.precision();
    std::ios::fmtflags stream_state(std::cout.flags());
    std::cout << std::fixed << std::setprecision(2);
    std::cout << ntotal << " "
              << topological_plural_name(mesh->family(), ent_dim);
    std::cout << ", " << name << " [" << actual.min << "," << actual.max << "]";
    if (nlow) {
      std::cout << ", " << nlow << " <" << desired.min;
    }
    if (nmid) {
      std::cout << ", " << nmid << " in [" << desired.min << "," << desired.max
                << "]";
    }
    if (nhigh) {
      std::cout << ", " << nhigh << " >" << desired.max;
    }
    std::cout << '\n';
    std::cout.flags(stream_state);
    std::cout.precision(precision_before);
  }
}